

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O0

int tcp_server(char *host,unsigned_short port)

{
  int iVar1;
  undefined4 local_34;
  hostent *phStack_30;
  int opt;
  hostent *hp;
  sockaddr_in sa_in;
  int sockfd;
  unsigned_short port_local;
  char *host_local;
  
  sa_in.sin_zero[0] = 0xff;
  sa_in.sin_zero[1] = 0xff;
  sa_in.sin_zero[2] = 0xff;
  sa_in.sin_zero[3] = 0xff;
  sa_in.sin_zero._6_2_ = port;
  sa_in.sin_zero._0_4_ = socket(2,1,0);
  if ((int)sa_in.sin_zero._0_4_ < 0) {
    perror("init socket");
    exit(1);
  }
  memset(&hp,0,0x10);
  hp._0_2_ = 2;
  hp._2_2_ = htons(sa_in.sin_zero._6_2_);
  if (host == (char *)0x0) {
    hp._4_4_ = htonl(0);
  }
  else {
    iVar1 = inet_pton(2,host,(void *)((long)&hp + 4));
    if (iVar1 == 0) {
      phStack_30 = gethostbyname(host);
      if (phStack_30 == (hostent *)0x0) {
        perror("get host name");
        exit(1);
      }
      hp._4_4_ = *(uint32_t *)*phStack_30->h_addr_list;
    }
  }
  local_34 = 1;
  setsockopt(sa_in.sin_zero._0_4_,1,2,&local_34,4);
  iVar1 = bind(sa_in.sin_zero._0_4_,(sockaddr *)&hp,0x10);
  if (iVar1 != -1) {
    listen(sa_in.sin_zero._0_4_,0x400);
    iVar1._0_1_ = sa_in.sin_zero[0];
    iVar1._1_1_ = sa_in.sin_zero[1];
    iVar1._2_1_ = sa_in.sin_zero[2];
    iVar1._3_1_ = sa_in.sin_zero[3];
    return iVar1;
  }
  close(sa_in.sin_zero._0_4_);
  perror("bind sockfd wit addr");
  exit(1);
}

Assistant:

int tcp_server(const char *host, unsigned short port) {
  int sockfd = -1;
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (sockfd < 0) {
    ERR_EXIT("init socket");
  }

  struct sockaddr_in sa_in;
  bzero(&sa_in, sizeof(sa_in));
  sa_in.sin_family = AF_INET;
  sa_in.sin_port = htons(port);
  if (host != NULL) {
    if (inet_pton(AF_INET, host, &sa_in.sin_addr) == 0) {
      //可能为主机地址
      struct hostent *hp;
      hp = gethostbyname(host);
      if (hp == NULL) {
        ERR_EXIT("get host name");
      }
      sa_in.sin_addr = *((struct in_addr *) hp->h_addr);
    }
  } else {
    sa_in.sin_addr.s_addr = htonl(INADDR_ANY);
  }

  int opt = 1;
  setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));

  if (bind(sockfd, (struct sockaddr *) &sa_in, sizeof(sa_in)) == -1) {
    close(sockfd);
    ERR_EXIT("bind sockfd wit addr");
  }

  listen(sockfd, LISTENQ);

  return sockfd;
}